

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O3

string * __thiscall
QPDF_String::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDF_String *this,bool force_binary)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  ulong uVar4;
  long *plVar5;
  long *plVar6;
  undefined7 in_register_00000011;
  char cVar7;
  undefined8 in_R8;
  size_type sVar8;
  ulong uVar9;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  cVar7 = (char)__return_storage_ptr__;
  if ((int)CONCAT71(in_register_00000011,force_binary) == 0) {
    bVar3 = useHexString(this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((this->val)._M_string_length != 0) {
        uVar4 = 0;
        uVar9 = 1;
        do {
          bVar1 = (this->val)._M_dataplus._M_p[uVar4];
          if (0x27 < bVar1) {
            if (((bVar1 != 0x28) && (bVar1 != 0x29)) && (bVar1 != 0x5c))
            goto switchD_002038c7_caseD_b;
            goto switchD_002038c7_caseD_a;
          }
          switch(bVar1) {
          case 8:
            break;
          case 9:
            break;
          case 10:
            break;
          default:
switchD_002038c7_caseD_b:
            if (bVar1 < 0xa0 && 0x5e < (byte)(bVar1 - 0x20)) {
              QUtil::int_to_string_base_abi_cxx11_(&local_50,(QUtil *)(ulong)bVar1,8,3,(int)in_R8);
              in_R8 = 1;
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_50,0,(char *)0x0,0x25eb07);
              local_70 = &local_60;
              plVar6 = plVar5 + 2;
              if ((long *)*plVar5 == plVar6) {
                local_60 = *plVar6;
                lStack_58 = plVar5[3];
              }
              else {
                local_60 = *plVar6;
                local_70 = (long *)*plVar5;
              }
              *plVar5 = (long)plVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
              if (local_70 != &local_60) {
                operator_delete(local_70,local_60 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              std::__cxx11::string::push_back(cVar7);
            }
            goto LAB_00203920;
          case 0xc:
            break;
          case 0xd:
          }
switchD_002038c7_caseD_a:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00203920:
          bVar3 = uVar9 < (this->val)._M_string_length;
          uVar4 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar3);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar7);
  sVar2 = (this->val)._M_string_length;
  if (sVar2 != 0) {
    sVar8 = 0;
    do {
      std::__cxx11::string::push_back(cVar7);
      std::__cxx11::string::push_back(cVar7);
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  std::__cxx11::string::push_back(cVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF_String::unparse(bool force_binary)
{
    bool use_hexstring = force_binary || useHexString();
    std::string result;
    if (use_hexstring) {
        static auto constexpr hexchars = "0123456789abcdef";
        result.reserve(2 * this->val.length() + 2);
        result += '<';
        for (const char c: this->val) {
            result += hexchars[static_cast<unsigned char>(c) >> 4];
            result += hexchars[c & 0x0f];
        }
        result += '>';
    } else {
        result += "(";
        for (unsigned int i = 0; i < this->val.length(); ++i) {
            char ch = this->val.at(i);
            switch (ch) {
            case '\n':
                result += "\\n";
                break;

            case '\r':
                result += "\\r";
                break;

            case '\t':
                result += "\\t";
                break;

            case '\b':
                result += "\\b";
                break;

            case '\f':
                result += "\\f";
                break;

            case '(':
                result += "\\(";
                break;

            case ')':
                result += "\\)";
                break;

            case '\\':
                result += "\\\\";
                break;

            default:
                if (is_iso_latin1_printable(ch)) {
                    result += this->val.at(i);
                } else {
                    result += "\\" +
                        QUtil::int_to_string_base(
                                  static_cast<int>(static_cast<unsigned char>(ch)), 8, 3);
                }
                break;
            }
        }
        result += ")";
    }

    return result;
}